

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateEqualsCode
          (EnumFieldGenerator *this,Printer *printer)

{
  Params *pPVar1;
  
  pPVar1 = (this->super_FieldGenerator).params_;
  if ((pPVar1->use_reference_types_for_primitives_ == true) &&
     (pPVar1->reftypes_primitive_enums_ == false)) {
    io::Printer::Print(printer,&this->variables_,
                       "if (this.$name$ == null) {\n  if (other.$name$ != null) {\n    return false;\n  }\n} else if (!this.$name$.equals(other.$name$)) {\n  return false;}\n"
                      );
    return;
  }
  io::Printer::Print(printer,&this->variables_,"if (this.$name$ != other.$name$");
  if (((this->super_FieldGenerator).params_)->generate_has_ == true) {
    io::Printer::Print(printer,&this->variables_,
                       "\n    || (this.$name$ == $default$\n        && this.has$capitalized_name$ != other.has$capitalized_name$)"
                      );
  }
  io::Printer::Print(printer,") {\n  return false;\n}\n");
  return;
}

Assistant:

void EnumFieldGenerator::GenerateEqualsCode(io::Printer* printer) const {
  if (params_.use_reference_types_for_primitives()
        && !params_.reftypes_primitive_enums()) {
    printer->Print(variables_,
      "if (this.$name$ == null) {\n"
      "  if (other.$name$ != null) {\n"
      "    return false;\n"
      "  }\n"
      "} else if (!this.$name$.equals(other.$name$)) {\n"
      "  return false;"
      "}\n");
  } else {
    // We define equality as serialized form equality. If generate_has(),
    // then if the field value equals the default value in both messages,
    // but one's 'has' field is set and the other's is not, the serialized
    // forms are different and we should return false.
    printer->Print(variables_,
      "if (this.$name$ != other.$name$");
    if (params_.generate_has()) {
      printer->Print(variables_,
        "\n"
        "    || (this.$name$ == $default$\n"
        "        && this.has$capitalized_name$ != other.has$capitalized_name$)");
    }
    printer->Print(") {\n"
      "  return false;\n"
      "}\n");
  }
}